

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_locale.cpp
# Opt level: O1

wchar_t * __thiscall
ON_Locale::GetAppleLanguageName(ON_Locale *this,wchar_t *buffer,size_t buffer_capacity)

{
  char cVar1;
  wchar_t *pwVar2;
  char *pcVar3;
  wchar_t *pwVar4;
  char cbuffer [128];
  char acStack_a8 [128];
  
  pcVar3 = GetAppleLanguageName(this,acStack_a8,0x80);
  if (buffer != (wchar_t *)0x0 && buffer_capacity != 0) {
    memset(buffer,0,buffer_capacity * 4);
    if (pcVar3 != (char *)0x0) {
      pwVar2 = buffer;
      do {
        pwVar4 = pwVar2;
        if (buffer + buffer_capacity <= pwVar4) {
          memset(buffer,0,buffer_capacity * 4);
          break;
        }
        cVar1 = *pcVar3;
        pcVar3 = pcVar3 + 1;
        *pwVar4 = (int)cVar1;
        pwVar2 = pwVar4 + 1;
      } while (cVar1 != '\0');
      if (pwVar4 < buffer + buffer_capacity) {
        return buffer;
      }
    }
  }
  return (wchar_t *)0x0;
}

Assistant:

const wchar_t* ON_Locale::GetAppleLanguageName(
  wchar_t* buffer,
  size_t buffer_capacity
  ) const
{
  char cbuffer[ON_Locale::BUFFER_MAXIMUM_CAPACITY];
  return (LocalWideStringBuider(
    GetAppleLanguageName(cbuffer,sizeof(cbuffer)/sizeof(cbuffer[0])),
    buffer,
    buffer_capacity
    ));
}